

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

RowGroupWriteData * __thiscall
duckdb::RowGroup::WriteToDisk
          (RowGroupWriteData *__return_storage_ptr__,RowGroup *this,RowGroupWriteInfo *info)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var1;
  RowGroup *pRVar2;
  ColumnData *pCVar3;
  pointer pCVar4;
  pointer this_00;
  storage_t c;
  ColumnCheckpointInfo checkpoint_info;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_c0;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> local_b8;
  RowGroup *local_b0;
  vector<duckdb::BaseStatistics,_true> *local_a8;
  RowGroupWriteInfo *local_a0;
  RowGroupWriteInfo *local_98;
  storage_t local_90;
  BaseStatistics local_88;
  
  (__return_storage_ptr__->statistics).
  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->statistics).
  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->statistics).
  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = info;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             *)__return_storage_ptr__,
            (long)(this->columns).
                  super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  .
                  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->columns).
                  super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  .
                  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_a8 = &__return_storage_ptr__->statistics;
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::reserve
            (&local_a8->
              super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>,
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  if ((this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    c = 0;
    local_b0 = this;
    do {
      pRVar2 = local_b0;
      pCVar3 = GetColumn(local_b0,c);
      local_98 = local_a0;
      local_90 = c;
      (*pCVar3->_vptr_ColumnData[0x1c])(&local_b8,pCVar3,pRVar2,&local_98);
      pCVar4 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
               ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                             *)&local_b8);
      (*pCVar4->_vptr_ColumnCheckpointState[2])(&local_c0,pCVar4);
      this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                              *)&local_c0);
      BaseStatistics::Copy(&local_88,this_00);
      ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::
      emplace_back<duckdb::BaseStatistics>
                (&local_a8->
                  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>,
                 &local_88);
      BaseStatistics::~BaseStatistics(&local_88);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                  *)&local_b8);
      _Var1._M_head_impl = local_c0._M_head_impl;
      if (local_c0._M_head_impl != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics(local_c0._M_head_impl);
        operator_delete(_Var1._M_head_impl);
      }
      if (local_b8._M_head_impl != (ColumnCheckpointState *)0x0) {
        (*(local_b8._M_head_impl)->_vptr_ColumnCheckpointState[1])();
      }
      c = c + 1;
    } while (c < (ulong)((long)(local_b0->columns).
                               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               .
                               super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_b0->columns).
                               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               .
                               super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return __return_storage_ptr__;
}

Assistant:

RowGroupWriteData RowGroup::WriteToDisk(RowGroupWriteInfo &info) {
	RowGroupWriteData result;
	result.states.reserve(columns.size());
	result.statistics.reserve(columns.size());

	// Checkpoint the individual columns of the row group
	// Here we're iterating over columns. Each column can have multiple segments.
	// (Some columns will be wider than others, and require different numbers
	// of blocks to encode.) Segments cannot span blocks.
	//
	// Some of these columns are composite (list, struct). The data is written
	// first sequentially, and the pointers are written later, so that the
	// pointers all end up densely packed, and thus more cache-friendly.
	for (idx_t column_idx = 0; column_idx < GetColumnCount(); column_idx++) {
		auto &column = GetColumn(column_idx);
		ColumnCheckpointInfo checkpoint_info(info, column_idx);
		auto checkpoint_state = column.Checkpoint(*this, checkpoint_info);
		D_ASSERT(checkpoint_state);

		auto stats = checkpoint_state->GetStatistics();
		D_ASSERT(stats);

		result.statistics.push_back(stats->Copy());
		result.states.push_back(std::move(checkpoint_state));
	}
	D_ASSERT(result.states.size() == result.statistics.size());
	return result;
}